

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

string * __thiscall
google::protobuf::internal::ExtensionSet::MutableRepeatedString_abi_cxx11_
          (ExtensionSet *this,int number,int index)

{
  byte bVar1;
  Extension *pEVar2;
  LogMessage *pLVar3;
  Type *pTVar4;
  LogMessage local_118;
  LogMessage local_e0;
  LogMessage local_a8;
  LogMessage local_70;
  LogFinisher local_31;
  
  pEVar2 = FindOrNull(this,number);
  if (pEVar2 == (Extension *)0x0) {
    LogMessage::LogMessage
              (&local_118,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
               ,0x224);
    pLVar3 = LogMessage::operator<<(&local_118,"CHECK failed: extension != NULL: ");
    pLVar3 = LogMessage::operator<<(pLVar3,"Index out-of-bounds (field is empty).");
    LogFinisher::operator=((LogFinisher *)&local_70,pLVar3);
    LogMessage::~LogMessage(&local_118);
  }
  if (pEVar2->is_repeated == false) {
    LogMessage::LogMessage
              (&local_e0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
               ,0x225);
    pLVar3 = LogMessage::operator<<
                       (&local_e0,
                        "CHECK failed: ((*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD) == (REPEATED_FIELD): "
                       );
    LogFinisher::operator=((LogFinisher *)&local_70,pLVar3);
    LogMessage::~LogMessage(&local_e0);
  }
  bVar1 = pEVar2->type;
  if ((byte)(bVar1 - 0x13) < 0xee) {
    LogMessage::LogMessage
              (&local_70,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
               ,0x3c);
    pLVar3 = LogMessage::operator<<
                       (&local_70,
                        "CHECK failed: type > 0 && type <= WireFormatLite::MAX_FIELD_TYPE: ");
    LogFinisher::operator=((LogFinisher *)&local_a8,pLVar3);
    LogMessage::~LogMessage(&local_70);
  }
  if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) != 9) {
    LogMessage::LogMessage
              (&local_a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/extension_set.cc"
               ,0x225);
    pLVar3 = LogMessage::operator<<
                       (&local_a8,
                        "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_STRING): "
                       );
    LogFinisher::operator=(&local_31,pLVar3);
    LogMessage::~LogMessage(&local_a8);
  }
  pTVar4 = RepeatedPtrFieldBase::
           Mutable<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                     ((RepeatedPtrFieldBase *)(pEVar2->field_0).string_value,index);
  return pTVar4;
}

Assistant:

std::string* ExtensionSet::MutableRepeatedString(int number, int index) {
  Extension* extension = FindOrNull(number);
  GOOGLE_CHECK(extension != NULL) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK_TYPE(*extension, REPEATED_FIELD, STRING);
  return extension->repeated_string_value->Mutable(index);
}